

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WhereExplainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  int p1;
  int extraout_EAX;
  Parse *pPVar1;
  
  pPVar1 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar1 = pParse;
  }
  if (((pPVar1->explain == '\x02') && ((wctrlFlags & 0x20) == 0)) &&
     (pPVar1 = (Parse *)pLevel->pWLoop, (pPVar1->iRangeReg & 0x2000U) == 0)) {
    p1 = pParse->pVdbe->nOp;
    sqlite3VdbeAddOp3(pParse->pVdbe,0xbc,p1,pParse->addrExplain,
                      (int)*(LogEst *)((long)&pPVar1->pVdbe + 4));
    sqlite3WhereAddExplainText(pParse,p1,pTabList,pLevel,wctrlFlags);
    return extraout_EAX;
  }
  return (int)pPVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  int ret = 0;
#if !defined(SQLITE_DEBUG)
  if( sqlite3ParseToplevel(pParse)->explain==2 || IS_STMT_SCANSTATUS(pParse->db) )
#endif
  {
    if( (pLevel->pWLoop->wsFlags & WHERE_MULTI_OR)==0
     && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0
    ){
      Vdbe *v = pParse->pVdbe;
      int addr = sqlite3VdbeCurrentAddr(v);
      ret = sqlite3VdbeAddOp3(
          v, OP_Explain, addr, pParse->addrExplain, pLevel->pWLoop->rRun
      );
      sqlite3WhereAddExplainText(pParse, addr, pTabList, pLevel, wctrlFlags);
    }
  }
  return ret;
}